

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_encode.c
# Opt level: O1

void yajl_string_decode(yajl_buf buf,uchar *str,size_t len)

{
  byte bVar1;
  bool bVar2;
  undefined4 uVar3;
  undefined1 uVar4;
  uint uVar5;
  ulong in_RAX;
  size_t sVar6;
  undefined1 *puVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  byte bVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  char *__s;
  ulong uVar15;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (len == 0) {
    uVar13 = 0;
    uVar15 = 0;
  }
  else {
    uVar13 = 0;
    uVar14 = 0;
    do {
      if (str[uVar14] == '\\') {
        yajl_buf_append(buf,str + uVar13,uVar14 - uVar13);
        uVar15 = uVar14 + 1;
        bVar1 = str[uVar14 + 1];
        if (bVar1 < 0x62) {
          if (bVar1 == 0x22) {
            __s = "\"";
          }
          else if (bVar1 == 0x2f) {
            __s = "/";
          }
          else {
            if (bVar1 != 0x5c) goto switchD_00104d46_caseD_6f;
            __s = "\\";
          }
        }
        else {
          switch(bVar1) {
          case 0x6e:
            __s = "\n";
            break;
          case 0x6f:
          case 0x70:
          case 0x71:
          case 0x73:
switchD_00104d46_caseD_6f:
            __s = "?";
            break;
          case 0x72:
            __s = "\r";
            break;
          case 0x74:
            __s = "\t";
            break;
          case 0x75:
            lVar8 = 0;
            uVar5 = 0;
            do {
              uVar10 = uVar5;
              bVar1 = str[lVar8 + uVar14 + 2];
              bVar9 = (bVar1 & 0xdf) - 7;
              if (bVar1 < 0x41) {
                bVar9 = bVar1;
              }
              uVar12 = uVar10 << 4;
              uVar5 = (byte)(bVar9 - 0x30) | uVar12;
              lVar8 = lVar8 + 1;
            } while (lVar8 != 4);
            if ((uVar10 & 0xfc0) == 0xd80) {
              uVar15 = uVar14 + 6;
              bVar2 = true;
              if ((str[uVar14 + 6] == '\\') && (str[uVar14 + 7] == 'u')) {
                lVar8 = 0;
                uVar5 = 0;
                do {
                  bVar1 = str[lVar8 + uVar14 + 8];
                  bVar11 = (bVar1 & 0xdf) - 7;
                  if (bVar1 < 0x41) {
                    bVar11 = bVar1;
                  }
                  uVar10 = uVar5 << 4;
                  uVar5 = (byte)(bVar11 - 0x30) | uVar10;
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 4);
                uVar5 = ((uint)(byte)(bVar9 - 0x30) | uVar12 & 0x3ff) * 0x400 +
                        ((uint)(byte)(bVar11 - 0x30) | uVar10 & 0x3ff) + 0x10000;
                uVar15 = uVar14 + 0xb;
                goto LAB_00104e82;
              }
              __s = "?";
            }
            else {
              uVar15 = uVar14 + 5;
LAB_00104e82:
              uVar4 = (undefined1)uVar5;
              uVar3 = uStack_38._4_4_;
              if (uVar5 < 0x80) {
LAB_00104e8e:
                uStack_38 = CONCAT44(uVar3,CONCAT13(uVar4,(undefined3)uStack_38));
                puVar7 = (undefined1 *)((long)&uStack_38 + 4);
              }
              else if (uVar5 < 0x800) {
                uStack_38 = CONCAT35(uStack_38._5_3_,
                                     CONCAT14(uVar4,CONCAT13((char)(uVar5 >> 6),
                                                             (undefined3)uStack_38))) &
                            0xffffff3fffffffff | 0x80c0000000;
                puVar7 = (undefined1 *)((long)&uStack_38 + 5);
              }
              else if (uVar5 < 0x10000) {
                uVar14 = CONCAT35(uStack_38._5_3_,
                                  CONCAT14((char)(uVar5 >> 6),
                                           CONCAT13((char)(uVar5 >> 0xc),(undefined3)uStack_38))) &
                         0xffffff3fffffffff;
                uStack_38._6_2_ = (undefined2)(uVar14 >> 0x30);
                uStack_38 = CONCAT26(uStack_38._6_2_,CONCAT15(uVar4,(int5)uVar14)) &
                            0xffff3fffffffffff | 0x8080e0000000;
                puVar7 = (undefined1 *)((long)&uStack_38 + 6);
              }
              else {
                if (0x1fffff < uVar5) {
                  uStack_38._3_1_ = 0x3f;
                  uVar4 = uStack_38._3_1_;
                  goto LAB_00104e8e;
                }
                uVar14 = CONCAT35(uStack_38._5_3_,
                                  CONCAT14((char)(uVar5 >> 0xc),
                                           CONCAT13((char)(uVar5 >> 0x12),(undefined3)uStack_38))) &
                         0xffffff3fffffffff;
                uStack_38._6_2_ = (undefined2)(uVar14 >> 0x30);
                uVar14 = CONCAT26(uStack_38._6_2_,CONCAT15((char)(uVar5 >> 6),(int5)uVar14)) &
                         0xffff3fffffffffff;
                uStack_38._7_1_ = (undefined1)(uVar14 >> 0x38);
                uStack_38 = CONCAT17(uStack_38._7_1_,CONCAT16(uVar4,(int6)uVar14)) &
                            0xff3fffffffffffff | 0x808080f0000000;
                puVar7 = (undefined1 *)((long)&uStack_38 + 7);
              }
              *puVar7 = 0;
              bVar2 = true;
              if (uVar5 == 0) {
                __s = (char *)((long)&uStack_38 + 3);
                yajl_buf_append(buf,__s,1);
                uVar13 = uVar15 + 1;
                bVar2 = false;
                uVar15 = uVar13;
              }
              else {
                __s = (char *)((long)&uStack_38 + 3);
              }
            }
            if (!bVar2) goto LAB_00104f94;
            break;
          default:
            if (bVar1 == 0x62) {
              __s = "\b";
            }
            else {
              if (bVar1 != 0x66) goto switchD_00104d46_caseD_6f;
              __s = "\f";
            }
          }
        }
        sVar6 = strlen(__s);
        yajl_buf_append(buf,__s,sVar6 & 0xffffffff);
        uVar13 = uVar15 + 1;
        uVar15 = uVar13;
      }
      else {
        uVar15 = uVar14 + 1;
      }
LAB_00104f94:
      uVar14 = uVar15;
    } while (uVar15 < len);
  }
  yajl_buf_append(buf,str + uVar13,uVar15 - uVar13);
  return;
}

Assistant:

void yajl_string_decode(yajl_buf buf, const unsigned char * str,
                        size_t len)
{
    size_t beg = 0;
    size_t end = 0;    

    while (end < len) {
        if (str[end] == '\\') {
            char utf8Buf[5];
            const char * unescaped = "?";
            yajl_buf_append(buf, str + beg, end - beg);
            switch (str[++end]) {
                case 'r': unescaped = "\r"; break;
                case 'n': unescaped = "\n"; break;
                case '\\': unescaped = "\\"; break;
                case '/': unescaped = "/"; break;
                case '"': unescaped = "\""; break;
                case 'f': unescaped = "\f"; break;
                case 'b': unescaped = "\b"; break;
                case 't': unescaped = "\t"; break;
                case 'u': {
                    unsigned int codepoint = 0;
                    hexToDigit(&codepoint, str + ++end);
                    end+=3;
                    /* check if this is a surrogate */
                    if ((codepoint & 0xFC00) == 0xD800) {
                        end++;
                        if (str[end] == '\\' && str[end + 1] == 'u') {
                            unsigned int surrogate = 0;
                            hexToDigit(&surrogate, str + end + 2);
                            codepoint =
                                (((codepoint & 0x3F) << 10) | 
                                 ((((codepoint >> 6) & 0xF) + 1) << 16) | 
                                 (surrogate & 0x3FF));
                            end += 5;
                        } else {
                            unescaped = "?";
                            break;
                        }
                    }
                    
                    Utf32toUtf8(codepoint, utf8Buf);
                    unescaped = utf8Buf;

                    if (codepoint == 0) {
                        yajl_buf_append(buf, unescaped, 1);
                        beg = ++end;
                        continue;
                    }

                    break;
                }
                default:
                    assert("this should never happen" == NULL);
            }
            yajl_buf_append(buf, unescaped, (unsigned int)strlen(unescaped));
            beg = ++end;
        } else {
            end++;
        }
    }
    yajl_buf_append(buf, str + beg, end - beg);
}